

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O0

void __thiscall eval_bin_op_Test::TestBody(eval_bin_op_Test *this)

{
  initializer_list<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_> __l;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  result_type rVar4;
  reference this_00;
  reference this_01;
  size_type sVar5;
  undefined4 extraout_var;
  char *pcVar6;
  reference ppVar7;
  undefined4 extraout_var_00;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> *local_1878;
  AssertHelper local_1840;
  Message local_1838;
  undefined1 local_1830 [8];
  AssertionResult gtest_ar_1;
  uint64_t result_1;
  uint64_t gold_1;
  uint64_t v2_1;
  uint64_t v1_1;
  type_conflict1 *v2__1;
  type_conflict1 *v1__1;
  long local_17e8;
  __normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
  local_17e0;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *__range2;
  Message local_17c0;
  undefined1 local_17b8 [8];
  AssertionResult gtest_ar;
  uint64_t result;
  long gold;
  type *v2;
  type *v1;
  long *local_1780;
  type *v2_;
  type *v1_;
  ulong local_1768;
  uint64_t i_1;
  type *func;
  type *op;
  _Self local_1748;
  iterator __end1;
  iterator __begin1;
  map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
  *__range1;
  ExprOp local_1728;
  anon_class_1_0_00000001 local_1719;
  ExprOp local_1718;
  anon_class_1_0_00000001 local_1709;
  ExprOp local_1708;
  anon_class_1_0_00000001 local_16f9;
  ExprOp local_16f8;
  anon_class_1_0_00000001 local_16e9;
  ExprOp local_16e8;
  anon_class_1_0_00000001 local_16d9;
  ExprOp local_16d8;
  anon_class_1_0_00000001 local_16c9;
  ExprOp local_16c8;
  anon_class_1_0_00000001 local_16b9;
  ExprOp local_16b8;
  anon_class_1_0_00000001 local_16a9;
  ExprOp local_16a8;
  anon_class_1_0_00000001 local_1699;
  ExprOp local_1698;
  anon_class_1_0_00000001 local_1689;
  ExprOp local_1688;
  anon_class_1_0_00000001 local_1679;
  ExprOp local_1678;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> *local_1670;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_1668;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_1640;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_1618;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_15f0;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_15c8;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_15a0;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_1578;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_1550;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_1528;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_1500;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_14d8;
  pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> local_14b0;
  undefined1 local_1488 [24];
  map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
  func_map;
  pair<long,_long> local_1438;
  unsigned_long local_1428;
  uint64_t value2;
  int64_t value2_;
  uint64_t value1;
  int64_t value1_;
  uint32_t i;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  eval_pairs;
  allocator<std::pair<long,_long>_> local_13d1;
  undefined1 local_13d0 [8];
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> input_pairs;
  uint num_test;
  uint64_t mask;
  undefined1 local_13a0 [4];
  int width;
  mt19937 rnd;
  size_t seed;
  eval_bin_op_Test *this_local;
  
  rnd._M_p = 0x2a;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_13a0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)local_13a0,rnd._M_p);
  input_pairs.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1a4;
  std::allocator<std::pair<long,_long>_>::allocator(&local_13d1);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_13d0,
             0x1a4,&local_13d1);
  std::allocator<std::pair<long,_long>_>::~allocator(&local_13d1);
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)((long)&value1_ + 7));
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&i,0x1a4,(allocator<std::pair<unsigned_long,_unsigned_long>_> *)((long)&value1_ + 7));
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::~allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)((long)&value1_ + 7));
  for (value1_._0_4_ = 0; (uint)value1_ < 0x1a4; value1_._0_4_ = (uint)value1_ + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_13a0);
    value1 = rVar4 % 0x3ff - 0x1ff;
    value2_ = value1 & 0x3ff;
    value2 = 0;
    local_1428 = 0;
    while (value2 == 0) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)local_13a0);
      value2 = rVar4 % 0x3ff - 0x1ff;
      local_1428 = value2 & 0x3ff;
    }
    std::pair<long,_long>::pair<long_&,_long_&,_true>(&local_1438,(long *)&value1,(long *)&value2);
    this_00 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
              operator[]((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                         local_13d0,(ulong)(uint)value1_);
    std::pair<long,_long>::operator=(this_00,&local_1438);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              ((pair<unsigned_long,_unsigned_long> *)
               &func_map._M_t._M_impl.super__Rb_tree_header._M_node_count,(unsigned_long *)&value2_,
               &local_1428);
    this_01 = std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)&i,(ulong)(uint)value1_);
    std::pair<unsigned_long,_unsigned_long>::operator=
              (this_01,(type)&func_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  local_1670 = &local_1668;
  local_1678 = Add;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:261:23),_true>
            (local_1670,&local_1678,&local_1679);
  local_1670 = &local_1640;
  local_1688 = Minus;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:262:25),_true>
            (local_1670,&local_1688,&local_1689);
  local_1670 = &local_1618;
  local_1698 = Multiply;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:263:28),_true>
            (local_1670,&local_1698,&local_1699);
  local_1670 = &local_15f0;
  local_16a8 = Divide;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:264:26),_true>
            (local_1670,&local_16a8,&local_16a9);
  local_1670 = &local_15c8;
  local_16b8 = And;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:265:23),_true>
            (local_1670,&local_16b8,&local_16b9);
  local_1670 = &local_15a0;
  local_16c8 = Or;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:266:22),_true>
            (local_1670,&local_16c8,&local_16c9);
  local_1670 = &local_1578;
  local_16d8 = Xor;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:267:23),_true>
            (local_1670,&local_16d8,&local_16d9);
  local_1670 = &local_1550;
  local_16e8 = Eq;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:268:22),_true>
            (local_1670,&local_16e8,&local_16e9);
  local_1670 = &local_1528;
  local_16f8 = GreaterEqThan;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:269:33),_true>
            (local_1670,&local_16f8,&local_16f9);
  local_1670 = &local_1500;
  local_1708 = GreaterThan;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:270:31),_true>
            (local_1670,&local_1708,&local_1709);
  local_1670 = &local_14d8;
  local_1718 = LessEqThan;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:271:30),_true>
            (local_1670,&local_1718,&local_1719);
  local_1670 = &local_14b0;
  local_1728 = LessThan;
  std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::
  pair<kratos::ExprOp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_tests_test_sim_cc:272:28),_true>
            (local_1670,&local_1728,(anon_class_1_0_00000001 *)((long)&__range1 + 7));
  local_1488._0_8_ = &local_1668;
  local_1488._8_8_ = 0xc;
  std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>::allocator
            ((allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_> *)
             ((long)&__range1 + 5));
  __l._M_len = local_1488._8_8_;
  __l._M_array = (iterator)local_1488._0_8_;
  std::
  map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
  ::map((map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
         *)(local_1488 + 0x10),__l,(less<kratos::ExprOp> *)((long)&__range1 + 6),
        (allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_> *)
        ((long)&__range1 + 5));
  std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>::~allocator
            ((allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_> *)
             ((long)&__range1 + 5));
  local_1878 = (pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> *)local_1488;
  do {
    local_1878 = local_1878 + -1;
    std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>::~pair(local_1878);
  } while (local_1878 != &local_1668);
  __end1 = std::
           map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
           ::begin((map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
                    *)(local_1488 + 0x10));
  local_1748._M_node =
       (_Base_ptr)
       std::
       map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
       ::end((map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
              *)(local_1488 + 0x10));
  while (bVar2 = std::operator!=(&__end1,&local_1748), bVar2) {
    op = &std::
          _Rb_tree_iterator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>::
          operator*(&__end1)->first;
    func = (type *)std::get<0ul,kratos::ExprOp_const,std::function<long(long,long)>>
                             ((pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> *)op);
    i_1 = (uint64_t)
          std::get<1ul,kratos::ExprOp_const,std::function<long(long,long)>>
                    ((pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_> *)op);
    for (local_1768 = 0; uVar1 = local_1768,
        sVar5 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                          ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *
                           )local_13d0), uVar1 < sVar5; local_1768 = local_1768 + 1) {
      v1_ = &std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::operator[]
                       ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                        local_13d0,local_1768)->first;
      v2_ = std::get<0ul,long,long>((pair<long,_long> *)v1_);
      local_1780 = std::get<1ul,long,long>((pair<long,_long> *)v1_);
      v1 = &std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          *)&i,local_1768)->first;
      v2 = std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)v1);
      gold = (long)std::get<1ul,unsigned_long,unsigned_long>
                             ((pair<unsigned_long,_unsigned_long> *)v1);
      result = std::function<long_(long,_long)>::operator()
                         ((function<long_(long,_long)> *)i_1,*v2_,*local_1780);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )kratos::eval_bin_op(*v2,*(uint64_t *)gold,
                                 *(ExprOp *)&(func->super__Function_base)._M_functor,10,true);
      if (((long)result < 0) ||
         (iVar3 = std::abs((int)result), 0x3ff < CONCAT44(extraout_var,iVar3))) {
        result = result & 0x3ff;
      }
      testing::internal::EqHelper::Compare<long,_unsigned_long,_nullptr>
                ((EqHelper *)local_17b8,"gold","result",(long *)&result,
                 (unsigned_long *)&gtest_ar.message_);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17b8);
      if (!bVar2) {
        testing::Message::Message(&local_17c0);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_17b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&__range2,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc"
                   ,0x11c,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&__range2,&local_17c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range2);
        testing::Message::~Message(&local_17c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_17b8);
    }
    __end2 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::begin
                       ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                        local_13d0);
    local_17e0._M_current =
         (pair<long,_long> *)
         std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::end
                   ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                    local_13d0);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&local_17e0), bVar2) {
      ppVar7 = __gnu_cxx::
               __normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
               ::operator*(&__end2);
      v1__1 = (type_conflict1 *)ppVar7->first;
      local_17e8 = ppVar7->second;
      v2__1 = std::get<0ul,long,long>((pair<long,_long> *)&v1__1);
      v1_1 = (uint64_t)std::get<1ul,long,long>((pair<long,_long> *)&v1__1);
      *v2__1 = *v2__1 + 0x1ff;
      *(uint64_t *)v1_1 = *(uint64_t *)v1_1 + 0x1ff;
      v2_1 = *v2__1;
      gold_1 = *(uint64_t *)v1_1;
      if (gold_1 != 0) {
        pcVar6 = (char *)std::function<long_(long,_long)>::operator()
                                   ((function<long_(long,_long)> *)i_1,*v2__1,*(uint64_t *)v1_1);
        iVar3 = kratos::truncate(pcVar6,10);
        result_1 = CONCAT44(extraout_var_00,iVar3);
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )kratos::eval_bin_op(v2_1,gold_1,*(ExprOp *)&(func->super__Function_base)._M_functor,
                                   10,false);
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_1830,"gold","result",&result_1,
                   (unsigned_long *)&gtest_ar_1.message_);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1830);
        if (!bVar2) {
          testing::Message::Message(&local_1838);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1830);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1840,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc"
                     ,0x127,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1840,&local_1838);
          testing::internal::AssertHelper::~AssertHelper(&local_1840);
          testing::Message::~Message(&local_1838);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1830);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
      ::operator++(&__end2);
    }
    std::_Rb_tree_iterator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>::
    operator++(&__end1);
  }
  std::
  map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
  ::~map((map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
          *)(local_1488 + 0x10));
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)&i);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_13d0);
  return;
}

Assistant:

TEST(eval, bin_op) {  // NOLINT
    size_t seed = 42;
    std::mt19937 rnd;  // NOLINT
    rnd.seed(seed);
    auto constexpr width = 10;
    auto constexpr mask = UINT64_MASK >> (64u - width);
    auto constexpr num_test = 420u;
    std::vector<std::pair<int64_t, int64_t>> input_pairs(num_test);
    std::vector<std::pair<uint64_t, uint64_t>> eval_pairs(num_test);
    for (uint32_t i = 0; i < num_test; i++) {
        int64_t value1_ = static_cast<int64_t>(rnd() % mask) - mask / 2;
        uint64_t value1 = *(reinterpret_cast<uint64_t *>(&value1_)) & mask;
        int64_t value2_ = 0;
        uint64_t value2 = 0;
        while (value2_ == 0) {
            value2_ = static_cast<int64_t>(rnd() % mask) - mask / 2;
            value2 = *(reinterpret_cast<uint64_t *>(&value2_)) & mask;
        }
        input_pairs[i] = {value1_, value2_};
        eval_pairs[i] = {value1, value2};
    }

    std::map<ExprOp, std::function<int64_t(int64_t, int64_t)>> func_map = {
        {ExprOp::Add, [](int64_t value1, int64_t value2) { return value1 + value2; }},
        {ExprOp::Minus, [](int64_t value1, int64_t value2) { return value1 - value2; }},
        {ExprOp::Multiply, [](int64_t value1, int64_t value2) { return value1 * value2; }},
        {ExprOp::Divide, [](int64_t value1, int64_t value2) { return value1 / value2; }},
        {ExprOp::And, [](int64_t value1, int64_t value2) { return value1 & value2; }},  // NOLINT
        {ExprOp::Or, [](int64_t value1, int64_t value2) { return value1 | value2; }},   // NOLINT
        {ExprOp::Xor, [](int64_t value1, int64_t value2) { return value1 ^ value2; }},  // NOLINT
        {ExprOp::Eq, [](int64_t value1, int64_t value2) { return value1 == value2; }},
        {ExprOp::GreaterEqThan, [](int64_t value1, int64_t value2) { return value1 >= value2; }},
        {ExprOp::GreaterThan, [](int64_t value1, int64_t value2) { return value1 > value2; }},
        {ExprOp::LessEqThan, [](int64_t value1, int64_t value2) { return value1 <= value2; }},
        {ExprOp::LessThan, [](int64_t value1, int64_t value2) { return value1 < value2; }}};

    for (auto const &[op, func] : func_map) {
        // signed
        for (uint64_t i = 0; i < input_pairs.size(); i++) {
            auto const &[v1_, v2_] = input_pairs[i];
            auto const &[v1, v2] = eval_pairs[i];
            auto gold = func(v1_, v2_);
            auto result = eval_bin_op(v1, v2, op, width, true);
            if (gold < 0 || static_cast<uint64_t>(abs(gold)) > mask) {
                gold = (*reinterpret_cast<uint64_t *>(&gold)) & mask;
            }
            EXPECT_EQ(gold, result);
        }
        // unsigned
        for (auto [v1_, v2_] : input_pairs) {
            v1_ += mask / 2;
            v2_ += mask / 2;
            auto v1 = static_cast<uint64_t>(v1_);
            auto v2 = static_cast<uint64_t>(v2_);
            if (v2 == 0) continue;
            auto gold = truncate(func(v1_, v2_), width);
            auto result = eval_bin_op(v1, v2, op, width, false);
            EXPECT_EQ(gold, result);
        }
    }
}